

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void bi_flush(deflate_state *s)

{
  ulg uVar1;
  deflate_state *s_local;
  
  if (s->bi_valid == 0x10) {
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = 0;
    s->bi_valid = 0;
  }
  else if (7 < s->bi_valid) {
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    s->bi_buf = s->bi_buf >> 8;
    s->bi_valid = s->bi_valid + -8;
  }
  return;
}

Assistant:

local void bi_flush(deflate_state *s) {
    if (s->bi_valid == 16) {
        put_short(s, s->bi_buf);
        s->bi_buf = 0;
        s->bi_valid = 0;
    } else if (s->bi_valid >= 8) {
        put_byte(s, (Byte)s->bi_buf);
        s->bi_buf >>= 8;
        s->bi_valid -= 8;
    }
}